

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O2

bool wabt::anon_unknown_0::FloatParser<float>::StringStartsWith(char *start,char *end,char *prefix)

{
  char cVar1;
  
  for (; (cVar1 = *prefix, start < end && (cVar1 != '\0')); prefix = prefix + 1) {
    if (*start != cVar1) {
      return false;
    }
    start = start + 1;
  }
  return cVar1 == '\0';
}

Assistant:

bool FloatParser<T>::StringStartsWith(const char* start,
                                      const char* end,
                                      const char* prefix) {
  while (start < end && *prefix) {
    if (*start != *prefix) {
      return false;
    }
    start++;
    prefix++;
  }
  return *prefix == 0;
}